

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_bang.c
# Opt level: O1

void bng_check_minmax(t_bng *x,int ftbreak,int fthold)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = fthold;
  if (fthold < ftbreak) {
    iVar1 = ftbreak;
  }
  if (ftbreak < fthold) {
    fthold = ftbreak;
  }
  iVar2 = 10;
  if (10 < fthold) {
    iVar2 = fthold;
  }
  iVar3 = 0x32;
  if (0x32 < iVar1) {
    iVar3 = iVar1;
  }
  x->x_flashtime_break = iVar2;
  x->x_flashtime_hold = iVar3;
  return;
}

Assistant:

void bng_check_minmax(t_bng *x, int ftbreak, int fthold)
{
    if(ftbreak > fthold)
    {
        int h;

        h = ftbreak;
        ftbreak = fthold;
        fthold = h;
    }
    if(ftbreak < IEM_BNG_MINBREAKFLASHTIME)
        ftbreak = IEM_BNG_MINBREAKFLASHTIME;
    if(fthold < IEM_BNG_MINHOLDFLASHTIME)
        fthold = IEM_BNG_MINHOLDFLASHTIME;
    x->x_flashtime_break = ftbreak;
    x->x_flashtime_hold = fthold;
}